

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void wallet::ApproximateBestSubset
               (FastRandomContext *insecure_rand,
               vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
               CAmount *nTotalLower,CAmount *nTargetValue,
               vector<char,_std::allocator<char>_> *vfBest,CAmount *nBest,int max_selection_weight,
               int iterations)

{
  byte bVar1;
  OutputGroup *pOVar2;
  CAmount CVar3;
  const_reference pvVar4;
  reference pvVar5;
  long *in_RCX;
  long *in_RDX;
  long *in_R9;
  long in_FS_OFFSET;
  bool bVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  uint i;
  int nPass;
  bool fReachedTarget;
  int selected_coins_weight;
  CAmount nTotal;
  int nRep;
  vector<char,_std::allocator<char>_> vfIncluded;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  OutputGroup *in_stack_ffffffffffffff68;
  uint local_80;
  int local_7c;
  int local_74;
  long local_70;
  int local_68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  vector<char,_std::allocator<char>_> *this;
  
  this = *(vector<char,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff58);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_ffffffffffffff58);
  std::vector<char,_std::allocator<char>_>::assign
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
  *in_R9 = *in_RDX;
  local_68 = 0;
  do {
    bVar6 = false;
    if (local_68 < in_stack_00000010) {
      bVar6 = *in_R9 != *in_RCX;
    }
    if (!bVar6) {
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68);
      if (*(vector<char,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28) != this) {
        __stack_chk_fail();
      }
      return;
    }
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_ffffffffffffff58);
    std::vector<char,_std::allocator<char>_>::assign
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
    local_70 = 0;
    local_74 = 0;
    bVar1 = 0;
    local_7c = 0;
    while( true ) {
      bVar6 = false;
      if (local_7c < 2) {
        bVar6 = (bool)(bVar1 ^ 1);
      }
      if (!bVar6) break;
      local_80 = 0;
      while( true ) {
        in_stack_ffffffffffffff68 = (OutputGroup *)(ulong)local_80;
        pOVar2 = (OutputGroup *)
                 std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                           ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                            in_stack_ffffffffffffff58);
        if (pOVar2 <= in_stack_ffffffffffffff68) break;
        if (local_7c == 0) {
          bVar6 = RandomMixin<FastRandomContext>::randbool(in_stack_ffffffffffffff58);
          if (bVar6) {
LAB_00bb1873:
            std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                      ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
            CVar3 = OutputGroup::GetSelectionAmount(in_stack_ffffffffffffff68);
            local_70 = CVar3 + local_70;
            pvVar4 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::
                     operator[]((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
                                )in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
            local_74 = pvVar4->m_weight + local_74;
            pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68,
                                in_stack_ffffffffffffff60);
            *pvVar5 = '\x01';
            if ((*in_RCX <= local_70) && (local_74 <= in_stack_00000008)) {
              bVar1 = 1;
              if (local_70 < *in_R9) {
                *in_R9 = local_70;
                std::vector<char,_std::allocator<char>_>::operator=(this,in_stack_fffffffffffffff0);
              }
              std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                        ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
              CVar3 = OutputGroup::GetSelectionAmount(in_stack_ffffffffffffff68);
              local_70 = local_70 - CVar3;
              pvVar4 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::
                       operator[]((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                   *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
              local_74 = local_74 - pvVar4->m_weight;
              pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff60);
              *pvVar5 = '\0';
            }
          }
        }
        else {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffff60);
          if (*pvVar5 == '\0') goto LAB_00bb1873;
        }
        local_80 = local_80 + 1;
      }
      local_7c = local_7c + 1;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

static void ApproximateBestSubset(FastRandomContext& insecure_rand, const std::vector<OutputGroup>& groups,
                                  const CAmount& nTotalLower, const CAmount& nTargetValue,
                                  std::vector<char>& vfBest, CAmount& nBest, int max_selection_weight, int iterations = 1000)
{
    std::vector<char> vfIncluded;

    // Worst case "best" approximation is just all of the groups.
    vfBest.assign(groups.size(), true);
    nBest = nTotalLower;

    for (int nRep = 0; nRep < iterations && nBest != nTargetValue; nRep++)
    {
        vfIncluded.assign(groups.size(), false);
        CAmount nTotal = 0;
        int selected_coins_weight{0};
        bool fReachedTarget = false;
        for (int nPass = 0; nPass < 2 && !fReachedTarget; nPass++)
        {
            for (unsigned int i = 0; i < groups.size(); i++)
            {
                //The solver here uses a randomized algorithm,
                //the randomness serves no real security purpose but is just
                //needed to prevent degenerate behavior and it is important
                //that the rng is fast. We do not use a constant random sequence,
                //because there may be some privacy improvement by making
                //the selection random.
                if (nPass == 0 ? insecure_rand.randbool() : !vfIncluded[i])
                {
                    nTotal += groups[i].GetSelectionAmount();
                    selected_coins_weight += groups[i].m_weight;
                    vfIncluded[i] = true;
                    if (nTotal >= nTargetValue && selected_coins_weight <= max_selection_weight) {
                        fReachedTarget = true;
                        // If the total is between nTargetValue and nBest, it's our new best
                        // approximation.
                        if (nTotal < nBest)
                        {
                            nBest = nTotal;
                            vfBest = vfIncluded;
                        }
                        nTotal -= groups[i].GetSelectionAmount();
                        selected_coins_weight -= groups[i].m_weight;
                        vfIncluded[i] = false;
                    }
                }
            }
        }
    }
}